

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall TileWire::followWire(TileWire *this,Direction direction,State state)

{
  char *pcVar1;
  uint uVar2;
  Direction DVar3;
  long lVar4;
  pointer ppVar5;
  undefined1 *puVar6;
  Vector2u *pVVar7;
  Board *pBVar8;
  Tile *pTVar9;
  _Elt_pointer ppVar10;
  Board *pBVar11;
  Configuration *pCVar12;
  ostream *poVar13;
  _Elt_pointer ppVar14;
  stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
  *this_00;
  pair<TileWire_*,_Direction> *wire;
  pointer ppVar15;
  FollowWireStage stage;
  State state_local;
  Vector2u local_40;
  undefined1 *local_38;
  
  stage = INITIAL_STAGE;
  state_local = state;
  _addNextTile(this,&this->super_Tile,direction,&state_local,&stage);
  if (wireNodes.c.
      super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      wireNodes.c.
      super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = &wireNodes;
    std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
    ::pop_back(&wireNodes.c);
    pcVar1 = &(&this->super_Tile)[(long)(int)(this->super_Tile)._direction * 2].field_0x21 +
             (long)(int)direction * 4 + (long)(int)this->_type * 0x10;
    if (*pcVar1 == '\x01') {
      this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                 *)this;
      pVVar7 = Tile::getPosition(&this->super_Tile);
      if (pVVar7->y != 0) {
        pBVar8 = Tile::getBoardPtr(&this->super_Tile);
        pVVar7 = Tile::getPosition(&this->super_Tile);
        uVar2 = pVVar7->x;
        pVVar7 = Tile::getPosition(&this->super_Tile);
        local_40.y = pVVar7->y - 1;
        local_40.x = uVar2;
        pTVar9 = Board::getTile(pBVar8,&local_40);
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)this;
        _addNextTile(this,pTVar9,NORTH,&state_local,&stage);
      }
    }
    if (pcVar1[1] == '\x01') {
      pVVar7 = Tile::getPosition(&this->super_Tile);
      uVar2 = pVVar7->x;
      this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                 *)Tile::getBoardPtr(&this->super_Tile);
      pVVar7 = Board::getSize((Board *)this_00);
      if (uVar2 < pVVar7->x - 1) {
        pBVar8 = Tile::getBoardPtr(&this->super_Tile);
        pVVar7 = Tile::getPosition(&this->super_Tile);
        uVar2 = pVVar7->x;
        pVVar7 = Tile::getPosition(&this->super_Tile);
        local_40.y = pVVar7->y;
        local_40.x = uVar2 + 1;
        pTVar9 = Board::getTile(pBVar8,&local_40);
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)this;
        _addNextTile(this,pTVar9,EAST,&state_local,&stage);
      }
    }
    if (pcVar1[2] == '\x01') {
      pVVar7 = Tile::getPosition(&this->super_Tile);
      uVar2 = pVVar7->y;
      this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                 *)Tile::getBoardPtr(&this->super_Tile);
      pVVar7 = Board::getSize((Board *)this_00);
      if (uVar2 < pVVar7->y - 1) {
        pBVar8 = Tile::getBoardPtr(&this->super_Tile);
        pVVar7 = Tile::getPosition(&this->super_Tile);
        uVar2 = pVVar7->x;
        pVVar7 = Tile::getPosition(&this->super_Tile);
        local_40.y = pVVar7->y + 1;
        local_40.x = uVar2;
        pTVar9 = Board::getTile(pBVar8,&local_40);
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)this;
        _addNextTile(this,pTVar9,SOUTH,&state_local,&stage);
      }
    }
    if (pcVar1[3] == '\x01') {
      this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                 *)this;
      pVVar7 = Tile::getPosition(&this->super_Tile);
      if (pVVar7->x != 0) {
        pBVar8 = Tile::getBoardPtr(&this->super_Tile);
        pVVar7 = Tile::getPosition(&this->super_Tile);
        uVar2 = pVVar7->x;
        pVVar7 = Tile::getPosition(&this->super_Tile);
        local_40.y = pVVar7->y;
        local_40.x = uVar2 - 1;
        pTVar9 = Board::getTile(pBVar8,&local_40);
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)this;
        _addNextTile(this,pTVar9,WEST,&state_local,&stage);
      }
    }
    local_38 = &(this->super_Tile).field_0x21;
    while (wireNodes.c.
           super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           wireNodes.c.
           super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (wireNodes.c.
          super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          wireNodes.c.
          super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar14 = wireNodes.c.
                  super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x1f;
        ppVar10 = wireNodes.c.
                  super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      else {
        ppVar14 = wireNodes.c.
                  super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        ppVar10 = wireNodes.c.
                  super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      pBVar8 = (Board *)ppVar14->first;
      DVar3 = ppVar10[-1].second;
      this_00 = &wireNodes;
      std::
      deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>::
      pop_back(&wireNodes.c);
      puVar6 = local_38;
      lVar4 = (long)(int)*(Direction *)&(pBVar8->super_Transformable)._vptr_Transformable * 0x50 +
              (long)(int)*(Type *)((long)&(pBVar8->switchUpdates)._M_h._M_before_begin._M_nxt + 4) *
              0x10;
      if ((local_38[(long)(int)DVar3 * 4 + lVar4] == '\x01') && (DVar3 != SOUTH)) {
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)pBVar8;
        pVVar7 = Tile::getPosition((Tile *)pBVar8);
        if (pVVar7->y != 0) {
          pBVar11 = Tile::getBoardPtr(&this->super_Tile);
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          uVar2 = pVVar7->x;
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          local_40.y = pVVar7->y - 1;
          local_40.x = uVar2;
          pTVar9 = Board::getTile(pBVar11,&local_40);
          this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                     *)this;
          _addNextTile(this,pTVar9,NORTH,&state_local,&stage);
        }
      }
      lVar4 = (long)(int)DVar3 * 4 + lVar4;
      if ((puVar6[lVar4 + 1] == '\x01') && (DVar3 != WEST)) {
        pVVar7 = Tile::getPosition((Tile *)pBVar8);
        uVar2 = pVVar7->x;
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)Tile::getBoardPtr(&this->super_Tile);
        pVVar7 = Board::getSize((Board *)this_00);
        if (uVar2 < pVVar7->x - 1) {
          pBVar11 = Tile::getBoardPtr(&this->super_Tile);
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          uVar2 = pVVar7->x;
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          local_40.y = pVVar7->y;
          local_40.x = uVar2 + 1;
          pTVar9 = Board::getTile(pBVar11,&local_40);
          this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                     *)this;
          _addNextTile(this,pTVar9,EAST,&state_local,&stage);
        }
      }
      if ((puVar6[lVar4 + 2] == '\x01') && (DVar3 != NORTH)) {
        pVVar7 = Tile::getPosition((Tile *)pBVar8);
        uVar2 = pVVar7->y;
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)Tile::getBoardPtr(&this->super_Tile);
        pVVar7 = Board::getSize((Board *)this_00);
        if (uVar2 < pVVar7->y - 1) {
          pBVar11 = Tile::getBoardPtr(&this->super_Tile);
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          uVar2 = pVVar7->x;
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          local_40.y = pVVar7->y + 1;
          local_40.x = uVar2;
          pTVar9 = Board::getTile(pBVar11,&local_40);
          this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                     *)this;
          _addNextTile(this,pTVar9,SOUTH,&state_local,&stage);
        }
      }
      if ((puVar6[lVar4 + 3] == '\x01') && (DVar3 != EAST)) {
        this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)pBVar8;
        pVVar7 = Tile::getPosition((Tile *)pBVar8);
        if (pVVar7->x != 0) {
          pBVar11 = Tile::getBoardPtr(&this->super_Tile);
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          uVar2 = pVVar7->x;
          pVVar7 = Tile::getPosition((Tile *)pBVar8);
          local_40.y = pVVar7->y;
          local_40.x = uVar2 - 1;
          pTVar9 = Board::getTile(pBVar11,&local_40);
          this_00 = (stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                     *)this;
          _addNextTile(this,pTVar9,WEST,&state_local,&stage);
        }
      }
    }
    if (stage == INVALID_STAGE) {
      _fixTraversedWires((TileWire *)this_00,MIDDLE);
      pCVar12 = Simulator::getConfig();
      if (pCVar12->pauseOnConflict == true) {
        if (Board::numStateErrors < 10) {
          poVar13 = std::operator<<((ostream *)&std::cout,
                                    "Detected state conflict in wire at position (");
          Tile::getPosition(&this->super_Tile);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          poVar13 = std::operator<<(poVar13,", ");
          Tile::getPosition(&this->super_Tile);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          poVar13 = std::operator<<(poVar13,").");
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        ppVar5 = traversedWires.
                 super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        Board::numStateErrors = Board::numStateErrors + 1;
        for (ppVar15 = traversedWires.
                       super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar5;
            ppVar15 = ppVar15 + 1) {
          Tile::setHighlight(&ppVar15->first->super_Tile,true);
        }
      }
    }
    if (traversedWires.
        super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        traversedWires.
        super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      traversedWires.
      super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           traversedWires.
           super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  return;
}

Assistant:

void TileWire::followWire(Direction direction, State state) {
    assert(traversedWires.empty());
    assert(wireNodes.empty());
    
    //cout << "Follow wire started at (" << getPosition().x << ", " << getPosition().y << ")." << endl;
    
    FollowWireStage stage = INITIAL_STAGE;
    _addNextTile(this, direction, state, stage);    // Add the first wire to the traversal. If it did not connect or was already checked then we return, otherwise continue traversal.
    if (wireNodes.empty()) {
        return;
    }
    wireNodes.pop();
    
    const bool* exitDirections = CONNECTION_INFO[_direction][_type][direction];    // Check for connection with all adjacent tiles (in the case that this is some arbitrary wire chosen and did not come from a source gate).
    if (exitDirections[0] && getPosition().y > 0) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1)), NORTH, state, stage);
    }
    if (exitDirections[1] && getPosition().x < getBoardPtr()->getSize().x - 1) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y)), EAST, state, stage);
    }
    if (exitDirections[2] && getPosition().y < getBoardPtr()->getSize().y - 1) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1)), SOUTH, state, stage);
    }
    if (exitDirections[3] && getPosition().x > 0) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y)), WEST, state, stage);
    }
    
    while (!wireNodes.empty()) {    // Perform depth-first traversal on remaining connected wires.
        TileWire* currentWire = wireNodes.top().first;
        Direction currentDirection = wireNodes.top().second;
        wireNodes.pop();
        //cout << "  currently at (" << currentWire->getPosition().x << ", " << currentWire->getPosition().y << ") going direction " << currentDirection << endl;
        
        const bool* exitDirections = CONNECTION_INFO[currentWire->_direction][currentWire->_type][currentDirection];    // Check for connection with adjacent tiles that do not point back to source wire.
        if (exitDirections[0] && currentDirection != SOUTH && currentWire->getPosition().y > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x, currentWire->getPosition().y - 1)), NORTH, state, stage);
        }
        if (exitDirections[1] && currentDirection != WEST && currentWire->getPosition().x < getBoardPtr()->getSize().x - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x + 1, currentWire->getPosition().y)), EAST, state, stage);
        }
        if (exitDirections[2] && currentDirection != NORTH && currentWire->getPosition().y < getBoardPtr()->getSize().y - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x, currentWire->getPosition().y + 1)), SOUTH, state, stage);
        }
        if (exitDirections[3] && currentDirection != EAST && currentWire->getPosition().x > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x - 1, currentWire->getPosition().y)), WEST, state, stage);
        }
    }
    
    if (stage == INVALID_STAGE) {    // Check if wire is in an invalid state and change it if so.
        _fixTraversedWires(MIDDLE);
        if (Simulator::getConfig().pauseOnConflict) {
            if (Board::numStateErrors < 10) {
                cout << "Detected state conflict in wire at position (" << getPosition().x << ", " << getPosition().y << ")." << endl;
            }
            ++Board::numStateErrors;
            for (pair<TileWire*, Direction>& wire : traversedWires) {
                wire.first->setHighlight(true);
            }
        }
    }
    traversedWires.clear();
}